

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::mouseMoveEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  byte bVar1;
  SubControl control;
  undefined1 auVar2 [16];
  bool bVar3;
  SubControl SVar4;
  int iVar5;
  int iVar6;
  Int IVar7;
  Operation OVar8;
  QObject *pQVar9;
  QMdiSubWindowPrivate *this_00;
  QStyle *pQVar10;
  ulong uVar11;
  QWidget *pos;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  SubControl oldHover;
  QMdiSubWindowPrivate *d;
  QRegion hoverRegion;
  QStyleOptionTitleBar options;
  undefined4 in_stack_fffffffffffffea8;
  MouseButton in_stack_fffffffffffffeac;
  QStyleOptionTitleBar *in_stack_fffffffffffffeb0;
  QMdiSubWindowPrivate *in_stack_fffffffffffffeb8;
  QMdiSubWindowPrivate *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  QMdiSubWindowPrivate *this_01;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c4;
  QRegion in_stack_ffffffffffffff40;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff48;
  undefined1 local_a8 [16];
  QRegion local_98;
  QPointF local_90;
  QPoint local_80;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = QObject::parent((QObject *)0x636605);
  if (pQVar9 == (QObject *)0x0) {
    QWidget::mouseMoveEvent
              ((QWidget *)in_stack_fffffffffffffeb0,
               (QMouseEvent *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    goto LAB_00636a63;
  }
  this_00 = d_func((QMdiSubWindow *)0x636629);
  bVar3 = QMdiSubWindowPrivate::isMoveOperation(this_00);
  if (!bVar3) {
    bVar3 = QMdiSubWindowPrivate::isResizeOperation(this_00);
    if (!bVar3) {
      memset(local_78,0xaa,0x70);
      QMdiSubWindowPrivate::titleBarOptions(this_00);
      control = this_00->hoveredSubControl;
      local_90 = QSinglePointEvent::position((QSinglePointEvent *)0x63669e);
      local_80 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffec0);
      SVar4 = QMdiSubWindowPrivate::getSubControl
                        ((QMdiSubWindowPrivate *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (QPoint *)in_stack_fffffffffffffec0);
      this_00->hoveredSubControl = SVar4;
      local_98.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion(&local_98);
      bVar3 = isHoverControl(control);
      auVar2._8_8_ = local_a8._8_8_;
      auVar2._0_8_ = local_a8._0_8_;
      if ((bVar3) && (local_a8 = auVar2, control != this_00->hoveredSubControl)) {
        pQVar10 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        local_a8 = (**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,5,local_78,control,in_RDI);
        QRegion::operator+=(&local_98,(QRect *)local_a8);
      }
      bVar3 = isHoverControl(this_00->hoveredSubControl);
      if ((bVar3) && (this_00->hoveredSubControl != control)) {
        pQVar10 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        in_stack_ffffffffffffff48 =
             (QMdiSubWindowPrivate *)
             (**(code **)(*(long *)pQVar10 + 0xd8))
                       (pQVar10,5,local_78,this_00->hoveredSubControl,in_RDI);
        QRegion::operator+=(&local_98,(QRect *)&stack0xffffffffffffff48);
      }
      QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      bVar3 = isMacStyle((QStyle *)in_stack_fffffffffffffec0);
      if (bVar3) {
        uVar11 = QRegion::isEmpty();
        if ((uVar11 & 1) == 0) {
          iVar5 = QWidget::width((QWidget *)0x636823);
          iVar6 = QMdiSubWindowPrivate::titleBarHeight
                            ((QMdiSubWindowPrivate *)CONCAT44(iVar5,in_stack_fffffffffffffec8),
                             (QStyleOptionTitleBar *)in_stack_fffffffffffffec0);
          QRegion::QRegion((QRegion *)&stack0xffffffffffffff40,0,0,iVar5,iVar6,Rectangle);
          QRegion::operator+=(&local_98,(QRegion *)&stack0xffffffffffffff40);
          QRegion::~QRegion((QRegion *)&stack0xffffffffffffff40);
        }
      }
      uVar11 = QRegion::isEmpty();
      if ((uVar11 & 1) == 0) {
        QWidget::update((QWidget *)in_stack_fffffffffffffec0,(QRegion *)in_stack_fffffffffffffeb8);
      }
      QRegion::~QRegion(&local_98);
      QStyleOptionTitleBar::~QStyleOptionTitleBar(in_stack_fffffffffffffeb0);
    }
  }
  QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_fffffffffffffeb0);
  local_c4.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  IVar7 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c4);
  bVar1 = 1;
  if (IVar7 == 0) {
    bVar1 = this_00->isInInteractiveMode;
  }
  if ((bVar1 & 1) != 0) {
    bVar3 = QMdiSubWindowPrivate::isResizeOperation(this_00);
    if ((!bVar3) || ((this_00->resizeEnabled & 1U) == 0)) {
      bVar3 = QMdiSubWindowPrivate::isMoveOperation(this_00);
      if ((!bVar3) || ((this_00->moveEnabled & 1U) == 0)) goto LAB_00636a63;
    }
    pos = QWidget::parentWidget((QWidget *)0x636965);
    QSinglePointEvent::globalPosition((QSinglePointEvent *)0x636974);
    QPointF::toPoint((QPointF *)this_00);
    QWidget::mapFromGlobal((QWidget *)this_00,(QPoint *)pos);
    QMdiSubWindowPrivate::setNewGeometry
              (in_stack_ffffffffffffff48,(QPoint *)in_stack_ffffffffffffff40.d);
    goto LAB_00636a63;
  }
  this_01 = this_00;
  QSinglePointEvent::position((QSinglePointEvent *)0x6369d7);
  QPointF::toPoint((QPointF *)in_stack_fffffffffffffec0);
  OVar8 = QMdiSubWindowPrivate::getOperation(in_stack_fffffffffffffeb8,(QPoint *)this_00);
  this_01->currentOperation = OVar8;
  bVar3 = QMdiSubWindowPrivate::isResizeOperation(this_01);
  if ((bVar3) && ((this_01->resizeEnabled & 1U) == 0)) {
LAB_00636a4a:
    this_01->currentOperation = None;
  }
  else {
    bVar3 = QMdiSubWindowPrivate::isMoveOperation(this_01);
    if ((bVar3) && ((this_01->moveEnabled & 1U) == 0)) goto LAB_00636a4a;
  }
  QMdiSubWindowPrivate::updateCursor(in_stack_fffffffffffffec0);
LAB_00636a63:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::mouseMoveEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseMoveEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    // No update needed if we're in a move/resize operation.
    if (!d->isMoveOperation() && !d->isResizeOperation()) {
        // Find previous and current hover region.
        const QStyleOptionTitleBar options = d->titleBarOptions();
        QStyle::SubControl oldHover = d->hoveredSubControl;
        d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
        QRegion hoverRegion;
        if (isHoverControl(oldHover) && oldHover != d->hoveredSubControl)
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options, oldHover, this);
        if (isHoverControl(d->hoveredSubControl) && d->hoveredSubControl != oldHover) {
            hoverRegion += style()->subControlRect(QStyle::CC_TitleBar, &options,
                    d->hoveredSubControl, this);
        }

        if (isMacStyle(style()) && !hoverRegion.isEmpty())
            hoverRegion += QRegion(0, 0, width(), d->titleBarHeight(options));

        if (!hoverRegion.isEmpty())
            update(hoverRegion);
    }

    if ((mouseEvent->buttons() & Qt::LeftButton) || d->isInInteractiveMode) {
        if ((d->isResizeOperation() && d->resizeEnabled) || (d->isMoveOperation() && d->moveEnabled)) {
            // As setNewGeometry moves the window, it invalidates the pos() value of any mouse move events that are
            // currently queued in the event loop. Map to parent using globalPos() instead.
            d->setNewGeometry(parentWidget()->mapFromGlobal(mouseEvent->globalPosition().toPoint()));
        }
        return;
    }

    // Do not resize/move if not allowed.
    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    if ((d->isResizeOperation() && !d->resizeEnabled) || (d->isMoveOperation() && !d->moveEnabled))
        d->currentOperation = QMdiSubWindowPrivate::None;
    d->updateCursor();
}